

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_redit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ROOM_INDEX_DATA *pRVar4;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  char arg1 [4608];
  ROOM_INDEX_DATA *pRoom2;
  ROOM_INDEX_DATA *pRoom;
  char *in_stack_00004918;
  CHAR_DATA *in_stack_00004920;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede8;
  int in_stack_ffffffffffffedec;
  char *in_stack_ffffffffffffedf0;
  ROOM_INDEX_DATA *in_stack_ffffffffffffee08;
  CHAR_DATA *in_stack_ffffffffffffee10;
  CHAR_DATA *in_stack_ffffffffffffee30;
  ROOM_INDEX_DATA *local_18;
  
  bVar1 = check_security(in_stack_ffffffffffffedd8);
  if (bVar1) {
    pcVar3 = one_argument(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8);
    local_18 = in_RDI->in_room;
    bVar1 = check_security(in_stack_ffffffffffffedd8);
    if (bVar1) {
      bVar1 = str_cmp(&stack0xffffffffffffedd8,"reset");
      if (bVar1) {
        bVar1 = str_cmp(&stack0xffffffffffffedd8,"create");
        if (bVar1) {
          atoi(&stack0xffffffffffffedd8);
          pRVar4 = get_room_index(in_stack_ffffffffffffedec);
          if (((pRVar4 == (ROOM_INDEX_DATA *)0x0) || (bVar1 = is_switched(in_RDI), bVar1)) ||
             (((pRVar4->area->security < in_RDI->pcdata->security ||
               (pcVar3 = strstr(pRVar4->area->builders,in_RDI->name), pcVar3 == (char *)0x0)) &&
              ((in_RDI->pcdata->security <= pRVar4->area->security &&
               (pcVar3 = strstr(pRVar4->area->builders,"All"), pcVar3 == (char *)0x0)))))) {
            iVar2 = atoi(&stack0xffffffffffffedd8);
            if (iVar2 != 0) {
              send_to_char(in_stack_ffffffffffffedf0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
              return;
            }
          }
          else {
            char_from_room(in_stack_ffffffffffffee30);
            char_to_room(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
            local_18 = in_RDI->in_room;
          }
        }
        else {
          if ((*pcVar3 == '\0') || (iVar2 = atoi(pcVar3), iVar2 == 0)) {
            send_to_char(in_stack_ffffffffffffedf0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8))
            ;
            return;
          }
          bVar1 = redit_create(in_RDI,pcVar3);
          if (bVar1) {
            char_from_room(in_stack_ffffffffffffee30);
            char_to_room(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
            _Var5 = std::pow<int,int>(0,0x76efcd);
            local_18->area->area_flags[0] = (long)_Var5 | local_18->area->area_flags[0];
            local_18 = in_RDI->in_room;
          }
        }
        bVar1 = is_switched(in_RDI);
        if ((bVar1) ||
           ((((local_18->area->security < in_RDI->pcdata->security ||
              (pcVar3 = strstr(local_18->area->builders,in_RDI->name), pcVar3 == (char *)0x0)) &&
             (in_RDI->pcdata->security <= local_18->area->security)) &&
            (pcVar3 = strstr(local_18->area->builders,"All"), pcVar3 == (char *)0x0)))) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
        }
        else {
          in_RDI->desc->editor = 2;
          redit_show(in_stack_00004920,in_stack_00004918);
        }
      }
      else {
        bVar1 = is_switched(in_RDI);
        if ((bVar1) ||
           (((local_18->area->security < in_RDI->pcdata->security ||
             (pcVar3 = strstr(local_18->area->builders,in_RDI->name), pcVar3 == (char *)0x0)) &&
            ((in_RDI->pcdata->security <= local_18->area->security &&
             (pcVar3 = strstr(local_18->area->builders,"All"), pcVar3 == (char *)0x0)))))) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
        }
        else {
          reset_room((ROOM_INDEX_DATA *)arg1._448_8_);
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
        }
      }
    }
  }
  return;
}

Assistant:

void do_redit(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom, *pRoom2;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	pRoom = ch->in_room;

	if (!check_security(ch))
		return;

	if (!str_cmp(arg1, "reset"))
	{
		if (!IS_BUILDER(ch, pRoom->area))
		{
			send_to_char("Insufficient security to modify area.\n\r", ch);
			return;
		}

		reset_room(pRoom);
		send_to_char("Room reset.\n\r", ch);
		return;
	}
	else if (!str_cmp(arg1, "create"))
	{
		if (argument[0] == '\0' || atoi(argument) == 0)
		{
			send_to_char("Syntax:  edit room create [vnum]\n\r", ch);
			return;
		}

		if (redit_create(ch, argument))
		{
			char_from_room(ch);
			char_to_room(ch, (ROOM_INDEX_DATA *)ch->desc->pEdit);
			SET_BIT(pRoom->area->area_flags, AREA_CHANGED);
			pRoom = ch->in_room;
		}
	}
	else
	{
		pRoom2 = get_room_index(atoi(arg1));

		if (pRoom2 != nullptr && IS_BUILDER(ch, pRoom2->area))
		{
			char_from_room(ch);
			char_to_room(ch, pRoom2);
			pRoom = ch->in_room;
		}
		else if (atoi(arg1) != 0)
		{
			send_to_char("Insufficient security to modify room, or room does not exist.\n\r", ch);
			return;
		}
	}

	if (!IS_BUILDER(ch, pRoom->area))
	{
		send_to_char("Insufficient security to modify area.\n\r", ch);
		return;
	}

	ch->desc->editor = ED_ROOM;
	redit_show(ch, "");
}